

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ynow,N_Vector fnow)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int error_code;
  char *msgfmt;
  double dVar6;
  double local_40;
  int curiter;
  
  piVar1 = (int *)cv_mem->cv_lmem;
  if (piVar1 == (int *)0x0) {
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
    iVar3 = 0x6c8;
    iVar2 = error_code;
LAB_00124c8a:
    cvProcessError(cv_mem,error_code,iVar3,"cvLsSolve",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,msgfmt);
  }
  else {
    if (cv_mem->cv_sensi == 0) {
LAB_00124ca4:
      lVar5 = 0x728;
    }
    else {
      iVar2 = cv_mem->cv_ism;
      if (iVar2 == 1) {
        lVar5 = 0x738;
      }
      else {
        if (iVar2 == 3) {
          lVar5 = 0x758;
        }
        else {
          if (iVar2 != 2) goto LAB_00124ca4;
          lVar5 = 0x748;
        }
        if (cv_mem->sens_solve == 0) goto LAB_00124ca4;
      }
    }
    SUNNonlinSolGetCurIter(*(undefined8 *)((long)&cv_mem->cv_sunctx + lVar5),&curiter);
    if (*piVar1 == 0) {
      local_40 = 0.0;
LAB_00124cf8:
      *(N_Vector *)(piVar1 + 0x1c) = ynow;
      *(N_Vector *)(piVar1 + 0x1e) = fnow;
      if (*(long *)(*(long *)(*(long *)(piVar1 + 0x12) + 8) + 0x20) == 0) {
        if (*piVar1 != 0) {
          N_VConst(0x3ff0000000000000,*(undefined8 *)(piVar1 + 0x1a));
          dVar6 = (double)N_VWrmsNorm(weight,*(undefined8 *)(piVar1 + 0x1a));
          local_40 = local_40 / dVar6;
        }
      }
      else {
        iVar2 = SUNLinSolSetScalingVectors(*(long *)(piVar1 + 0x12),weight,weight);
        if (iVar2 != 0) {
          cvProcessError(cv_mem,-9,0x6ff,"cvLsSolve",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"Error in calling SUNLinSolSetScalingVectors");
          piVar1[0x4e] = -9;
          return -9;
        }
      }
      N_VConst(0,*(undefined8 *)(piVar1 + 0x1a));
      iVar2 = SUNLinSolSetZeroGuess(*(undefined8 *)(piVar1 + 0x12),1);
      if (iVar2 != 0) {
        return -1;
      }
      if (*(code **)(piVar1 + 0x40) != (code *)0x0) {
        iVar2 = (**(code **)(piVar1 + 0x40))(cv_mem->cv_tn,ynow,fnow,*(undefined8 *)(piVar1 + 0x46))
        ;
        piVar1[0x4e] = iVar2;
        *(long *)(piVar1 + 0x30) = *(long *)(piVar1 + 0x30) + 1;
        if (iVar2 != 0) {
          cvProcessError(cv_mem,0,0x72f,"cvLsSolve",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"The Jacobian x vector setup routine failed in an unrecoverable manner.");
          return piVar1[0x4e];
        }
      }
      iVar3 = SUNLinSolSolve(local_40,*(undefined8 *)(piVar1 + 0x12),*(undefined8 *)(piVar1 + 0x14),
                             *(undefined8 *)(piVar1 + 0x1a),b);
      N_VScale(0x3ff0000000000000,*(undefined8 *)(piVar1 + 0x1a),b);
      if (piVar1[0xc] != 0) {
        dVar6 = cv_mem->cv_gamrat;
        if ((dVar6 != 1.0) || (NAN(dVar6))) {
          N_VScale(2.0 / (dVar6 + 1.0),b,b);
        }
      }
      if ((*piVar1 == 0) || (*(long *)(*(long *)(*(long *)(piVar1 + 0x12) + 8) + 0x48) == 0)) {
        lVar5 = 0;
      }
      else {
        iVar2 = SUNLinSolNumIters();
        lVar5 = (long)iVar2;
      }
      *(long *)(piVar1 + 0x2a) = *(long *)(piVar1 + 0x2a) + lVar5;
      if (iVar3 != 0) {
        *(long *)(piVar1 + 0x2e) = *(long *)(piVar1 + 0x2e) + 1;
        piVar1[0x4e] = iVar3;
        uVar4 = iVar3 - 0x321;
        if (uVar4 < 8) {
          if ((0xf6U >> (uVar4 & 0x1f) & 1) != 0) {
            return 1;
          }
          if (uVar4 == 0) {
            return (uint)(curiter != 0);
          }
        }
        iVar2 = -1;
        if (iVar3 + 9999U < 2) {
          return -1;
        }
        if (iVar3 + 0x32bU < 2) {
          return -1;
        }
        if (iVar3 == -0x2705) {
          return -1;
        }
        if (iVar3 == -0x2703) {
          msgfmt = "Failure in SUNLinSol external package";
          error_code = -0x2703;
          iVar3 = 0x772;
        }
        else if (iVar3 == -0x328) {
          msgfmt = "The preconditioner solve routine failed in an unrecoverable manner.";
          error_code = -0x328;
          iVar3 = 0x77c;
        }
        else {
          if (iVar3 != -0x325) {
            return 0;
          }
          msgfmt = "The Jacobian x vector routine failed in an unrecoverable manner.";
          error_code = -0x325;
          iVar3 = 0x777;
        }
        goto LAB_00124c8a;
      }
    }
    else {
      local_40 = *(double *)(piVar1 + 0xe) * cv_mem->cv_tq[4];
      dVar6 = (double)N_VWrmsNorm(b,weight);
      if (local_40 < dVar6) {
        local_40 = local_40 * *(double *)(piVar1 + 0x10);
        goto LAB_00124cf8;
      }
      if (0 < curiter) {
        N_VConst(0,b);
      }
    }
    piVar1[0x4e] = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cvLsSolve(CVodeMem cv_mem, N_Vector b, N_Vector weight, N_Vector ynow,
              N_Vector fnow)
{
  CVLsMem cvls_mem;
  sunrealtype bnorm = ZERO;
  sunrealtype deltar, delta, w_mean;
  int curiter, nli_inc, retval;
  sunbooleantype do_sensi_sim, do_sensi_stg, do_sensi_stg1;
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  sunrealtype resnorm;
  long int nps_inc;
#endif

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* are we computing sensitivities and with which approach? */
  do_sensi_sim  = (cv_mem->cv_sensi && (cv_mem->cv_ism == CV_SIMULTANEOUS));
  do_sensi_stg  = (cv_mem->cv_sensi && (cv_mem->cv_ism == CV_STAGGERED));
  do_sensi_stg1 = (cv_mem->cv_sensi && (cv_mem->cv_ism == CV_STAGGERED1));

  /* get current nonlinear solver iteration */
  if (do_sensi_sim)
  {
    retval = SUNNonlinSolGetCurIter(cv_mem->NLSsim, &curiter);
  }
  else if (do_sensi_stg && cv_mem->sens_solve)
  {
    retval = SUNNonlinSolGetCurIter(cv_mem->NLSstg, &curiter);
  }
  else if (do_sensi_stg1 && cv_mem->sens_solve)
  {
    retval = SUNNonlinSolGetCurIter(cv_mem->NLSstg1, &curiter);
  }
  else { retval = SUNNonlinSolGetCurIter(cv_mem->NLS, &curiter); }

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (cvls_mem->iterative)
  {
    deltar = cvls_mem->eplifac * cv_mem->cv_tq[4];
    bnorm  = N_VWrmsNorm(b, weight);
    if (bnorm <= deltar)
    {
      if (curiter > 0) { N_VConst(ZERO, b); }
      cvls_mem->last_flag = CVLS_SUCCESS;
      return (cvls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * cvls_mem->nrmfac;
  }
  else { delta = ZERO; }

  /* Set vectors ycur and fcur for use by the Atimes and Psolve
     interface routines */
  cvls_mem->ycur = ynow;
  cvls_mem->fcur = fnow;

  /* Set scaling vectors for LS to use (if applicable) */
  if (cvls_mem->LS->ops->setscalingvectors)
  {
    retval = SUNLinSolSetScalingVectors(cvls_mem->LS, weight, weight);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetScalingVectors");
      cvls_mem->last_flag = CVLS_SUNLS_FAIL;
      return (cvls_mem->last_flag);
    }

    /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for weight vector.  We make the
     following assumptions:
       1. w_i = w_mean, for i=0,...,n-1 (i.e. the weights are homogeneous)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(w)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (w_i (b - A x)_i)^2 < tol^2
       <=> w_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / w_mean^2
       <=> || b - A x ||_2 < tol / w_mean
     So we compute w_mean = ||w||_RMS = ||w||_2 and scale the desired tolerance accordingly. */
  }
  else if (cvls_mem->iterative)
  {
    N_VConst(ONE, cvls_mem->x);
    w_mean = N_VWrmsNorm(weight, cvls_mem->x);
    delta /= w_mean;
  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, cvls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(cvls_mem->LS, SUNTRUE);
  if (retval != SUN_SUCCESS) { return (-1); }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  /* Store previous nps value in nps_inc */
  nps_inc = cvls_mem->nps;
#endif

  /* If a user-provided jtsetup routine is supplied, call that here */
  if (cvls_mem->jtsetup)
  {
    cvls_mem->last_flag = cvls_mem->jtsetup(cv_mem->cv_tn, ynow, fnow,
                                            cvls_mem->jt_data);
    cvls_mem->njtsetup++;
    if (cvls_mem->last_flag != 0)
    {
      cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                     MSG_LS_JTSETUP_FAILED);
      return (cvls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(cvls_mem->LS, cvls_mem->A, cvls_mem->x, b, delta);
  N_VScale(ONE, cvls_mem->x, b);

  /* If using a direct or matrix-iterative solver, BDF method, and gamma has changed,
     scale the correction to account for change in gamma */
  if (cvls_mem->scalesol && cv_mem->cv_gamrat != ONE)
  {
    N_VScale(TWO / (ONE + cv_mem->cv_gamrat), b, b);
  }

  /* Retrieve statistics from iterative linear solvers */
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  resnorm = ZERO;
#endif
  nli_inc = 0;
  if (cvls_mem->iterative)
  {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    if (cvls_mem->LS->ops->resnorm) resnorm = SUNLinSolResNorm(cvls_mem->LS);
#endif
    if (cvls_mem->LS->ops->numiters)
    {
      nli_inc = SUNLinSolNumIters(cvls_mem->LS);
    }
  }

  /* Increment counters nli and ncfl */
  cvls_mem->nli += nli_inc;
  if (retval != SUN_SUCCESS) { cvls_mem->ncfl++; }

  /* Interpret solver return value  */
  cvls_mem->last_flag = retval;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_DEBUG, "CVODE::cvLsSolve",
                     "ls-stats", "bnorm = %.16g, resnorm = %.16g, ls_iters = %i, prec_solves = %i",
                     bnorm, resnorm, nli_inc, (int)(cvls_mem->nps - nps_inc));
#endif

  switch (retval)
  {
  case SUN_SUCCESS: return (0); break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first Newton iteration,
       otherwise return with a recoverable failure */
    if (curiter == 0) { return (0); }
    else { return (1); }
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL: return (1); break;
  case SUN_ERR_ARG_CORRUPT:
  case SUN_ERR_ARG_INCOMPATIBLE:
  case SUN_ERR_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL: return (-1); break;
  case SUN_ERR_EXT_FAIL:
    cvProcessError(cv_mem, SUN_ERR_EXT_FAIL, __LINE__, __func__, __FILE__,
                   "Failure in SUNLinSol external package");
    return (-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_ATIMES_FAIL_UNREC, __LINE__, __func__,
                   __FILE__, MSG_LS_JTIMES_FAILED);
    return (-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PSOLVE_FAIL_UNREC, __LINE__, __func__,
                   __FILE__, MSG_LS_PSOLVE_FAILED);
    return (-1);
    break;
  }

  return (0);
}